

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O2

Wlc_Ntk_t * Wlc_NtkGraftMulti(Wlc_Ntk_t *p,int fVerbose)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  Gia_Man_t *p_00;
  Vec_Mem_t *p_01;
  Vec_Wrd_t *pVVar5;
  Gia_Obj_t *pGVar6;
  word *pwVar7;
  word wVar8;
  Wlc_Obj_t *pWVar9;
  Wlc_Obj_t *pWVar10;
  ulong uVar11;
  int iVar12;
  char *__s;
  Vec_Int_t *p_02;
  long lVar13;
  int nMultiRHS;
  int nMultiLHS;
  Vec_Int_t *local_40;
  Vec_Mem_t *vTtMem;
  
  pVVar3 = Wlc_NtkCollectObjs(p,0,&nMultiLHS);
  iVar12 = 1;
  pVVar4 = Wlc_NtkCollectObjs(p,1,&nMultiRHS);
  iVar2 = 0;
  p_00 = Wlc_NtkBitBlast(p,(Wlc_BstPar_t *)0x0);
  p_01 = Vec_MemAlloc(4,iVar2);
  vTtMem = p_01;
  Vec_MemHashAlloc(p_01,10000);
  iVar2 = nMultiLHS;
  if (nMultiLHS == 0 && nMultiRHS == 0) {
    __s = "No multipliers are present.";
  }
  else {
    if (nMultiRHS < 1 || nMultiLHS < 1) {
      if (nMultiRHS < 1) {
        p_02 = pVVar3;
        local_40 = pVVar4;
        if (nMultiLHS < 1) {
          __assert_fail("nMultiLHS > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                        ,0xeb,"Wlc_Ntk_t *Wlc_NtkGraftMulti(Wlc_Ntk_t *, int)");
        }
      }
      else {
        nMultiLHS = nMultiRHS;
        nMultiRHS = iVar2;
        p_02 = pVVar4;
        local_40 = pVVar3;
      }
      if (nMultiRHS == 0) {
        Vec_WrdFreeP(&p_00->vSims);
        pVVar5 = Vec_WrdStart(p_00->nObjs << 2);
        p_00->vSims = pVVar5;
        p_00->nSimWords = 4;
        Gia_ManRandomW(1);
        while ((iVar12 < p_00->nObjs &&
               (pGVar6 = Gia_ManObj(p_00,iVar12), pGVar6 != (Gia_Obj_t *)0x0))) {
          uVar1 = (uint)*(ulong *)pGVar6;
          uVar11 = *(ulong *)pGVar6 & 0x1fffffff;
          if (uVar11 == 0x1fffffff || (int)uVar1 < 0) {
            if ((int)uVar1 < 0 && (int)uVar11 != 0x1fffffff) {
              Wlc_ObjSimCo(p_00,iVar12);
            }
            else {
              if ((~uVar1 & 0x9fffffff) != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                              ,0xfc,"Wlc_Ntk_t *Wlc_NtkGraftMulti(Wlc_Ntk_t *, int)");
              }
              pwVar7 = Wlc_ObjSim(p_00,iVar12);
              for (lVar13 = 0; lVar13 < p_00->nSimWords; lVar13 = lVar13 + 1) {
                wVar8 = Gia_ManRandomW(0);
                pwVar7[lVar13] = wVar8;
              }
              *pwVar7 = *pwVar7 << 1;
            }
          }
          else {
            Wlc_ObjSimAnd(p_00,iVar12);
          }
          iVar12 = iVar12 + 1;
        }
        pwVar7 = Wlc_ObjSim(p_00,0);
        Vec_MemHashInsert(p_01,pwVar7);
        for (iVar12 = 0; pVVar3 = local_40, iVar12 < p_02->nSize; iVar12 = iVar12 + 1) {
          iVar2 = Vec_IntEntry(p_02,iVar12);
          pWVar9 = Wlc_NtkObj(p,iVar2);
          if ((undefined1  [24])((undefined1  [24])*pWVar9 & (undefined1  [24])0x3f) ==
              (undefined1  [24])0x2d) {
            iVar2 = Wlc_ObjFaninId(pWVar9,0);
            pWVar10 = Wlc_NtkObj(p,iVar2);
            Wlc_NtkSaveOneNode(p,pWVar10,p_00,p_01);
            iVar2 = Wlc_ObjFaninId(pWVar9,1);
            pWVar10 = Wlc_NtkObj(p,iVar2);
            Wlc_NtkSaveOneNode(p,pWVar10,p_00,p_01);
            Wlc_NtkSaveOneNode(p,pWVar9,p_00,p_01);
          }
        }
        for (iVar12 = 0; iVar12 < pVVar3->nSize; iVar12 = iVar12 + 1) {
          iVar2 = Vec_IntEntry(pVVar3,iVar12);
          pWVar9 = Wlc_NtkObj(p,iVar2);
          Wlc_NtkFindOneNode(p,pWVar9,p_00,p_01);
        }
        Vec_MemHashFree(p_01);
        Vec_MemFreeP(&vTtMem);
        Vec_WrdFreeP(&p_00->vSims);
        p_00->nSimWords = 0;
        Vec_IntFree(p_02);
        Vec_IntFree(pVVar3);
        Gia_ManStop(p_00);
        return (Wlc_Ntk_t *)0x0;
      }
      __assert_fail("nMultiRHS == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                    ,0xec,"Wlc_Ntk_t *Wlc_NtkGraftMulti(Wlc_Ntk_t *, int)");
    }
    __s = "Multipliers are present in both sides of the miter.";
  }
  puts(__s);
  return (Wlc_Ntk_t *)0x0;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkGraftMulti( Wlc_Ntk_t * p, int fVerbose )
{
    int nWords = 4;
    int i, nMultiLHS, nMultiRHS;
    word * pInfoObj;
    Wlc_Ntk_t * pNew = NULL;
    Wlc_Obj_t * pWlcObj;
    Gia_Obj_t * pObj;
    Vec_Int_t * vObjsLHS = Wlc_NtkCollectObjs( p, 0, &nMultiLHS );
    Vec_Int_t * vObjsRHS = Wlc_NtkCollectObjs( p, 1, &nMultiRHS );
    Gia_Man_t * pGia = Wlc_NtkBitBlast( p, NULL ); //, -1, 0, 0, 0, 0, 1, 0, 0 ); // <= no cleanup
    Vec_Mem_t * vTtMem = Vec_MemAlloc( nWords, 10 );
    Vec_MemHashAlloc( vTtMem, 10000 );

    // check if there are multipliers
    if ( nMultiLHS == 0 && nMultiRHS == 0 )
    {
        printf( "No multipliers are present.\n" );
        return NULL;
    }
    // compare multipliers
    if ( nMultiLHS > 0 && nMultiRHS > 0 )
    {
        printf( "Multipliers are present in both sides of the miter.\n" );
        return NULL;
    }
    // swap if wrong side
    if ( nMultiRHS > 0 )
    {
        ABC_SWAP( Vec_Int_t *, vObjsLHS, vObjsRHS );
        ABC_SWAP( int, nMultiLHS, nMultiRHS );
    }
    assert( nMultiLHS > 0 );
    assert( nMultiRHS == 0 );

    // allocate simulation info for one timeframe
    Vec_WrdFreeP( &pGia->vSims );
    pGia->vSims = Vec_WrdStart( Gia_ManObjNum(pGia) * nWords );
    pGia->nSimWords = nWords;
    // perform simulation
    Gia_ManRandomW( 1 );
    Gia_ManForEachObj1( pGia, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Wlc_ObjSimAnd( pGia, i );
        else if ( Gia_ObjIsCo(pObj) )
            Wlc_ObjSimCo( pGia, i );
        else if ( Gia_ObjIsCi(pObj) )
            Wlc_ObjSimPi( pGia, i );
        else assert( 0 );
    }

    // hash constant 0
    pInfoObj = Wlc_ObjSim( pGia, 0 );
    Vec_MemHashInsert( vTtMem, pInfoObj );

    // hash sim info on the multiplier boundary
    Wlc_NtkForEachObjVec( vObjsLHS, p, pWlcObj, i )
        if ( Wlc_ObjType(pWlcObj) == WLC_OBJ_ARI_MULTI )
        {
            Wlc_NtkSaveOneNode( p, Wlc_ObjFanin0(p, pWlcObj), pGia, vTtMem );
            Wlc_NtkSaveOneNode( p, Wlc_ObjFanin1(p, pWlcObj), pGia, vTtMem );
            Wlc_NtkSaveOneNode( p, pWlcObj, pGia, vTtMem );
        }

    // check if there are similar signals in LHS
    Wlc_NtkForEachObjVec( vObjsRHS, p, pWlcObj, i )
        Wlc_NtkFindOneNode( p, pWlcObj, pGia, vTtMem );

    // perform grafting


    Vec_MemHashFree( vTtMem );
    Vec_MemFreeP( &vTtMem );

    // cleanup
    Vec_WrdFreeP( &pGia->vSims );
    pGia->nSimWords = 0;

    Vec_IntFree( vObjsLHS );
    Vec_IntFree( vObjsRHS );
    Gia_ManStop( pGia );
    return pNew;
}